

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O0

void __thiscall Planner::Planner(Planner *this,string *nume)

{
  string *nume_local;
  Planner *this_local;
  
  this->_vptr_Planner = (_func_int **)&PTR__Planner_0011ecb8;
  std::__cxx11::string::string((string *)&this->nume,nume);
  std::vector<std::shared_ptr<Lista>,_std::allocator<std::shared_ptr<Lista>_>_>::vector
            (&this->Liste);
  std::vector<std::shared_ptr<Backlog>,_std::allocator<std::shared_ptr<Backlog>_>_>::vector
            (&this->Backlogs);
  return;
}

Assistant:

Planner::Planner(const std::string &nume) : nume(nume) {}